

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::exceed_texture_image_units_limit
               (NegativeTestContext *ctx)

{
  int iVar1;
  deUint32 program_00;
  ostream *poVar2;
  RenderContext *renderCtx;
  ProgramSources *sources;
  MessageBuilder *pMVar3;
  ProgramInfo *pPVar4;
  allocator<char> local_869;
  string local_868;
  MessageBuilder local_848;
  MessageBuilder local_6c8;
  TestLog *local_548;
  TestLog *log;
  string local_520;
  string local_500;
  ShaderSource local_4e0;
  ProgramSources local_4b8;
  undefined1 local_3e8 [8];
  ShaderProgram program;
  int i;
  ostringstream local_308 [8];
  ostringstream shaderBody;
  ostringstream local_190 [8];
  ostringstream shaderDecl;
  int limit;
  NegativeTestContext *ctx_local;
  
  iVar1 = getResourceLimit(ctx,0x91bc);
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_308);
  poVar2 = std::operator<<((ostream *)local_190,"layout(binding = 0) ");
  poVar2 = std::operator<<(poVar2,"uniform highp sampler2D u_sampler[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1 + 2);
  poVar2 = std::operator<<(poVar2,"];\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(binding = 0) buffer Output {\n");
  poVar2 = std::operator<<(poVar2,"    vec4 values[ ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1 + 2);
  poVar2 = std::operator<<(poVar2," ];\n");
  std::operator<<(poVar2,"} sb_out;\n");
  for (program.m_program.m_info.linkTimeUs._0_4_ = 0;
      (int)program.m_program.m_info.linkTimeUs < iVar1 + 2;
      program.m_program.m_info.linkTimeUs._0_4_ = (int)program.m_program.m_info.linkTimeUs + 1) {
    poVar2 = std::operator<<((ostream *)local_308,"   sb_out.values[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)program.m_program.m_info.linkTimeUs);
    poVar2 = std::operator<<(poVar2,"] = texture(u_sampler[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)program.m_program.m_info.linkTimeUs);
    std::operator<<(poVar2,"], vec2(1.0f));\n");
  }
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_4b8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  generateComputeShader(&local_500,ctx,&local_520,(string *)&log);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_4e0,&local_500);
  sources = glu::ProgramSources::operator<<(&local_4b8,&local_4e0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_3e8,renderCtx,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&log);
  std::__cxx11::string::~string((string *)&local_520);
  glu::ProgramSources::~ProgramSources(&local_4b8);
  local_548 = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  tcu::TestLog::operator<<(&local_6c8,local_548,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (&local_6c8,
                      (char (*) [95])
                      "Possible link error is generated if compute shader exceeds GL_MAX_COMPUTE_TEXTURE_IMAGE_UNITS."
                     );
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_6c8);
  glu::operator<<(local_548,(ShaderProgram *)local_3e8);
  pPVar4 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)local_3e8);
  if ((pPVar4->linkOk & 1U) != 0) {
    tcu::TestLog::operator<<(&local_848,local_548,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_848,
                        (char (*) [51])"Quality Warning: program was not expected to link.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_848);
    program_00 = glu::ShaderProgram::getProgram((ShaderProgram *)local_3e8);
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program_00);
    NegativeTestContext::expectError(ctx,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_868,
               "GL_INVALID_OPERATION error is generated if the sum of the number of active samplers for each active program exceeds the maximum number of texture image units allowed"
               ,&local_869);
    NegativeTestContext::beginSection(ctx,&local_868);
    std::__cxx11::string::~string((string *)&local_868);
    std::allocator<char>::~allocator(&local_869);
    glu::CallLogWrapper::glDispatchCompute(&ctx->super_CallLogWrapper,1,1,1);
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
  }
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_3e8);
  std::__cxx11::ostringstream::~ostringstream(local_308);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void exceed_texture_image_units_limit (NegativeTestContext& ctx)
{
	const int			limit			= getResourceLimit(ctx, GL_MAX_COMPUTE_TEXTURE_IMAGE_UNITS) + 1;
	std::ostringstream	shaderDecl;
	std::ostringstream	shaderBody;

	shaderDecl	<< "layout(binding = 0) "
				<< "uniform highp sampler2D u_sampler[" << limit + 1 << "];\n"
				<< "\n"
				<< "layout(binding = 0) buffer Output {\n"
				<< "    vec4 values[ " << limit + 1 << " ];\n"
				<< "} sb_out;\n";

	for (int i = 0; i < limit + 1; ++i)
		shaderBody	<< "   sb_out.values[" << i << "] = texture(u_sampler[" << i << "], vec2(1.0f));\n";

	glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources()
			<< glu::ComputeSource(generateComputeShader(ctx, shaderDecl.str(), shaderBody.str())));

	tcu::TestLog& log = ctx.getLog();
	log << tcu::TestLog::Message << "Possible link error is generated if compute shader exceeds GL_MAX_COMPUTE_TEXTURE_IMAGE_UNITS." << tcu::TestLog::EndMessage;
	log << program;

	if (program.getProgramInfo().linkOk)
	{
		log << tcu::TestLog::Message << "Quality Warning: program was not expected to link." << tcu::TestLog::EndMessage;
		ctx.glUseProgram(program.getProgram());
		ctx.expectError(GL_NO_ERROR);

		ctx.beginSection("GL_INVALID_OPERATION error is generated if the sum of the number of active samplers for each active program exceeds the maximum number of texture image units allowed");
		ctx.glDispatchCompute(1, 1, 1);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.endSection();
	}
}